

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

int count_buc(obj *list,int type)

{
  boolean bVar1;
  int local_20;
  int count;
  int type_local;
  obj *list_local;
  
  local_20 = 0;
  _count = list;
  do {
    if (_count == (obj *)0x0) {
      return local_20;
    }
    if (urole.malenum == 0x161) {
      *(uint *)&_count->field_0x4a = *(uint *)&_count->field_0x4a & 0xffffffbf | 0x40;
    }
    if (type == 0x80) {
      if (((_count->oclass != '\f') && ((*(uint *)&_count->field_0x4a >> 6 & 1) != 0)) &&
         ((*(uint *)&_count->field_0x4a >> 1 & 1) != 0)) {
        local_20 = local_20 + 1;
      }
    }
    else if (type == 0x100) {
      if (((_count->oclass != '\f') && ((*(uint *)&_count->field_0x4a >> 6 & 1) != 0)) &&
         ((*(uint *)&_count->field_0x4a & 1) != 0)) {
        local_20 = local_20 + 1;
      }
    }
    else if (type == 0x200) {
      if (((_count->oclass != '\f') && ((*(uint *)&_count->field_0x4a >> 6 & 1) != 0)) &&
         (((*(uint *)&_count->field_0x4a >> 1 & 1) == 0 && ((*(uint *)&_count->field_0x4a & 1) == 0)
          ))) {
        local_20 = local_20 + 1;
      }
    }
    else if (type == 0x400) {
      if ((_count->oclass != '\f') && ((*(uint *)&_count->field_0x4a >> 6 & 1) == 0)) {
        local_20 = local_20 + 1;
      }
    }
    else {
      if (type != 0x800) {
        impossible("need count of curse status %d?",(ulong)(uint)type);
        return 0;
      }
      bVar1 = not_fully_identified_core(_count,'\x01');
      if (bVar1 != '\0') {
        local_20 = local_20 + 1;
      }
    }
    _count = _count->nobj;
  } while( true );
}

Assistant:

int count_buc(struct obj *list, int type)
{
    int count = 0;

    while (list) {
	if (Role_if (PM_PRIEST)) list->bknown = TRUE;
	switch(type) {
	    case BUC_BLESSED:
		if (list->oclass != COIN_CLASS && list->bknown && list->blessed)
		    count++;
		break;
	    case BUC_CURSED:
		if (list->oclass != COIN_CLASS && list->bknown && list->cursed)
		    count++;
		break;
	    case BUC_UNCURSED:
		if (list->oclass != COIN_CLASS &&
			list->bknown && !list->blessed && !list->cursed)
		    count++;
		break;
	    case BUC_UNKNOWN:
		if (list->oclass != COIN_CLASS && !list->bknown)
		    count++;
		break;
	    case UNIDENTIFIED:
		if (not_fully_identified_core(list, TRUE))
		    count++;
		break;
	    default:
		impossible("need count of curse status %d?", type);
		return 0;
	}
	list = list->nobj;
    }
    return count;
}